

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O0

float wlapv(qnode_ptr_t p,int x,int y,float a,float c)

{
  undefined4 in_XMM0_Db;
  undefined4 in_XMM1_Db;
  float d;
  float c_local;
  float a_local;
  int y_local;
  int x_local;
  qnode_ptr_t p_local;
  
  return (float)(double)CONCAT44(in_XMM0_Db,a) *
         ((*p->flow_ptr)[p->res * (x + -1) + y].y + (*p->flow_ptr)[p->res * (x + 1) + y].y) +
         (float)(double)CONCAT44(in_XMM1_Db,c) *
         ((*p->flow_ptr)[p->res * x + y + -1].y + (*p->flow_ptr)[p->res * x + y + 1].y);
}

Assistant:

float wlapv(p,x,y,a,c)
qnode_ptr_t p ;
int x, y ;
float a, c ;

{ float d ;

  d = a*((*p->flow_ptr)[p->res*(x-1) + y].y +
  (*p->flow_ptr)[p->res*(x+1) + y].y) +
  c*((*p->flow_ptr)[p->res*x + (y-1)].y +
  (*p->flow_ptr)[p->res*x + (y+1)].y) ;
  return(d) ;
}